

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O1

void av1_update_and_record_txb_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  short *psVar1;
  int *piVar2;
  TX_CLASS tx_class;
  char cVar3;
  ushort eob;
  short sVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  int16_t *scan;
  short sVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  TxSetType TVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ushort uVar25;
  int iVar26;
  long lVar27;
  macroblockd_plane *__dest;
  long lVar28;
  ushort *puVar29;
  int iVar30;
  macroblockd_plane *pd;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  aom_cdf_prob *cdf;
  int iVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  MB_MODE_INFO *mbmi;
  byte *pbVar42;
  char cVar43;
  bool bVar44;
  macroblockd_plane *local_15f0;
  uint local_15b0;
  TXB_CTX txb_ctx;
  uint8_t levels_buf [1312];
  int8_t coeff_contexts [4096];
  
  lVar6 = *(long *)((long)arg + 8);
  lVar27 = (long)plane;
  lVar41 = (long)block;
  lVar7 = **(long **)(lVar6 + 0x2058);
  eob = *(ushort *)(*(long *)(lVar6 + 0x20 + lVar27 * 0x88) + lVar41 * 2);
  lVar24 = *arg;
  bVar9 = *(byte *)(lVar6 + 0x1b0 + lVar27 * 0xa30);
  uVar22 = (ulong)bVar9;
  uVar14 = (ulong)tx_size;
  if ((*(int *)(lVar6 + 0x2b64 + (ulong)(*(ushort *)(lVar7 + 0xa7) & 7) * 4) == 0) &&
     ((0x61810UL >> (uVar14 & 0x3f) & 1) == 0)) {
    if (uVar22 == 0) {
      bVar15 = *(byte *)(*(long *)(lVar6 + 0x2088) +
                        (long)(*(int *)(lVar6 + 0x2090) * blk_row + blk_col));
    }
    else {
      cVar43 = (char)*(ushort *)(lVar7 + 0xa7);
      if ((cVar43 < '\0') || ('\0' < *(char *)(lVar7 + 0x10))) {
        pbVar42 = (byte *)((long)((blk_row << (*(byte *)(lVar6 + 0x1b8 + uVar22 * 0xa30) & 0x1f)) *
                                  *(int *)(lVar6 + 0x2090) +
                                 (blk_col << (*(byte *)(lVar6 + 0x1b4 + uVar22 * 0xa30) & 0x1f))) +
                          *(long *)(lVar6 + 0x2088));
      }
      else {
        pbVar42 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                  (byte)get_uv_mode_uv2y[*(byte *)(lVar7 + 3)];
      }
      uVar20 = 1;
      if (-1 < cVar43) {
        uVar20 = (uint)('\0' < *(char *)(lVar7 + 0x10));
      }
      if ((0x18608UL >> (uVar14 & 0x3f) & 1) == 0) {
        if (*(char *)(lVar24 + 0x3c175) == '\0') {
          uVar20 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> (uVar14 & 0x3f) & 1) != 0) + (ulong)(uVar20 * 2)];
        }
        else {
          uVar20 = (uint)(byte)((uVar20 == 0) + 1);
        }
      }
      uVar20 = *(uint *)((long)av1_ext_tx_used[0] + (ulong)*pbVar42 * 4 + (ulong)(uVar20 << 6));
      if (uVar20 != 0) {
        uVar20 = (uint)*pbVar42;
      }
      bVar15 = (byte)uVar20;
    }
  }
  else {
    bVar15 = 0;
  }
  uVar33 = (ulong)bVar15;
  lVar7 = lVar6 + lVar27 * 0xa30;
  pd = (macroblockd_plane *)(lVar7 + 0x1b0);
  local_15f0 = (macroblockd_plane *)
               ((long)(block << 4) * 4 + *(long *)(lVar6 + 0x10 + lVar27 * 0x88));
  uVar20 = (uint)eob;
  if (*(char *)((long)arg + 0x15) != '\0') goto LAB_00a55f78;
  lVar28 = **(long **)(lVar6 + 0x2058);
  get_txb_ctx(plane_bsize,tx_size,plane,
              (ENTROPY_CONTEXT *)((long)blk_col + *(long *)(lVar7 + 0x220)),
              (ENTROPY_CONTEXT *)((long)blk_row + *(long *)(lVar7 + 0x228)),&txb_ctx);
  uVar21 = (uint)tx_size;
  if (tx_size < 0x11) {
    uVar12 = 3;
    if ((1 < uVar21 - 0xb) && (uVar21 != 4)) {
LAB_00a55280:
      uVar12 = uVar14;
    }
  }
  else if (uVar21 == 0x11) {
    uVar12 = 9;
  }
  else {
    if (uVar21 != 0x12) goto LAB_00a55280;
    uVar12 = 10;
  }
  uVar10 = (uint)tx_size;
  if (tx_size < 0x11) {
    uVar23 = 3;
    if ((1 < uVar10 - 0xb) && (uVar21 != 4)) {
LAB_00a552b9:
      uVar23 = uVar14;
    }
  }
  else if (uVar10 == 0x11) {
    uVar23 = 9;
  }
  else {
    if (uVar21 != 0x12) goto LAB_00a552b9;
    uVar23 = 10;
  }
  if (tx_size < 0x11) {
    uVar31 = 3;
    if ((1 < uVar10 - 0xb) && (uVar10 != 4)) {
LAB_00a55301:
      uVar31 = uVar14;
    }
  }
  else if (uVar10 == 0x11) {
    uVar31 = 9;
  }
  else {
    if (uVar10 != 0x12) goto LAB_00a55301;
    uVar31 = 10;
  }
  iVar34 = tx_size_high_log2[uVar12];
  iVar35 = tx_size_wide[uVar23];
  iVar26 = tx_size_high[uVar31];
  cVar43 = *(char *)((long)arg + 0x14);
  bVar18 = ""[uVar14];
  bVar19 = ""[uVar14];
  uVar10 = (uint)bVar18 + (uint)bVar19 + 1 >> 1;
  uVar38 = uVar10 & 0xff;
  lVar7 = *(long *)(lVar6 + 0x2b38);
  if (cVar43 != '\0') {
    puVar29 = (ushort *)((ulong)uVar38 * 0x4e + lVar7 + (long)txb_ctx.txb_skip_ctx * 6);
    bVar16 = (char)(puVar29[2] >> 4) + 4;
    uVar25 = *puVar29;
    if (eob == 0) {
      sVar4 = (short)((int)(0x8000 - (uint)uVar25) >> (bVar16 & 0x1f));
    }
    else {
      sVar4 = -(uVar25 >> (bVar16 & 0x1f));
    }
    *puVar29 = uVar25 + sVar4;
    puVar29[2] = puVar29[2] + (ushort)(puVar29[2] < 0x20);
  }
  lVar37 = *(long *)(lVar6 + 0x4190);
  uVar12 = (ulong)(*(ushort *)(*(long *)(lVar6 + 0x4178) + 0x4e + uVar22 * 2) >> 4);
  lVar36 = *(long *)(lVar37 + 0x18 + lVar27 * 8);
  lVar32 = uVar12 + *(long *)(lVar37 + 0x30 + lVar27 * 8);
  *(undefined1 *)(lVar41 + lVar32) = (undefined1)txb_ctx.txb_skip_ctx;
  *(ushort *)(uVar12 * 2 + lVar36 + lVar41 * 2) = eob;
  if (eob == 0) {
    __dest = pd;
    av1_set_entropy_contexts
              ((MACROBLOCKD *)(lVar6 + 0x1a0),pd,plane,plane_bsize,tx_size,0,blk_col,blk_row);
  }
  else {
    if (((0xc < tx_size) || (iVar30 = 0x400, (0x1810U >> (uVar21 & 0x1f) & 1) == 0)) &&
       (iVar30 = 0x200, 1 < (byte)(tx_size - 0x11))) {
      iVar30 = tx_size_2d[uVar14];
    }
    local_15b0 = uVar10 & 0xff;
    if ((*(char *)(lVar24 + 0x409b8) != '\0') &&
       ((*(byte *)(lVar24 + 0x40a3c + (ulong)(*(ushort *)(lVar28 + 0xa7) & 7) * 4) & 0x40) != 0)) {
      iVar30 = 0;
    }
    __dest = (macroblockd_plane *)
             ((ulong)*(ushort *)(*(long *)(lVar6 + 0x4178) + 0x4e + uVar22 * 2) * 4 +
              *(long *)(lVar37 + lVar27 * 8) + (long)(block << 4) * 4);
    memcpy(__dest,local_15f0,(long)iVar30 << 2);
    (*av1_txb_init_levels)((tran_low_t *)__dest,iVar35,iVar26,levels_buf);
    lVar27 = **(long **)(lVar6 + 0x2058);
    uVar21 = 1;
    if (-1 < (char)*(ushort *)(lVar27 + 0xa7)) {
      uVar21 = (uint)('\0' < *(char *)(lVar27 + 0x10));
    }
    if (plane < 1) {
      uVar11 = *(ushort *)(lVar27 + 0xa7) & 7;
      if ((*(int *)(lVar6 + 0x2b64 + (ulong)uVar11 * 4) == 0) &&
         ((0x61810UL >> (uVar14 & 0x3f) & 1) == 0)) {
        uVar12 = (ulong)*(byte *)(*(long *)(lVar6 + 0x2088) +
                                 (long)(*(int *)(lVar6 + 0x2090) * blk_row + blk_col));
      }
      else {
        uVar12 = 0;
      }
      bVar16 = *(byte *)(lVar24 + 0x3c175);
      if ((0x61810UL >> (uVar14 & 0x3f) & 1) == 0) {
        if ((0x18608UL >> (uVar14 & 0x3f) & 1) == 0) {
          TVar17 = '\x01';
          if (bVar16 == 0) {
            TVar17 = av1_ext_tx_set_lookup[0]
                     [(ulong)((0x60604UL >> (uVar14 & 0x3f) & 1) != 0) + (ulong)(uVar21 * 2)];
          }
        }
        else {
          TVar17 = (TxSetType)uVar21;
        }
      }
      else {
        TVar17 = '\0';
      }
      if ((((TVar17 != '\0') && (0 < *(int *)(lVar24 + 0x3c1e8))) &&
          (*(char *)(lVar27 + 0x90) == '\0')) &&
         ((lVar28 = *(long *)(lVar6 + 0x2b38), *(char *)(lVar24 + 0x409b8) == '\0' ||
          ((*(byte *)(lVar24 + 0x40a3c + (ulong)uVar11 * 4) & 0x40) == 0)))) {
        uVar11 = get_ext_tx_set(tx_size,uVar21,(uint)bVar16);
        if (0 < (int)uVar11) {
          bVar16 = av1_get_ext_tx_set_type(tx_size,uVar21,(uint)bVar16);
          if (uVar21 == 0) {
            if (*(char *)(lVar27 + 0x5b) == '\0') {
              pbVar42 = (byte *)(lVar27 + 2);
            }
            else {
              pbVar42 = "" + *(byte *)(lVar27 + 0x5a);
            }
            if (cVar43 != '\0') {
              cdf = (aom_cdf_prob *)
                    (lVar28 + (ulong)bVar18 * 0x1ba + (ulong)uVar11 * 0x6e8 +
                     (ulong)*pbVar42 * 0x20 + (ulong)*pbVar42 * 2 + 0x3b42);
              goto LAB_00a56157;
            }
          }
          else if (cVar43 != '\0') {
            cdf = (aom_cdf_prob *)
                  (lVar28 + (ulong)uVar11 * 0x88 + (ulong)bVar18 * 0x20 + (ulong)bVar18 * 2 + 0x4ffa
                  );
LAB_00a56157:
            update_cdf(cdf,(int8_t)av1_ext_tx_ind[bVar16][uVar12],av1_num_ext_tx_set[bVar16]);
          }
        }
      }
    }
    tx_class = ""[uVar33];
    scan = av1_scan_orders[tx_size][bVar15].scan;
    piVar2 = (int *)((ulong)tx_size * 0x40 + lVar6 + 0x256c8 + uVar33 * 4);
    *piVar2 = *piVar2 + 1;
    if (eob < 0x21) {
      pcVar13 = "" + eob;
    }
    else {
      uVar21 = uVar20 - 1 >> 5;
      uVar12 = 0x10;
      if (uVar21 < 0x10) {
        uVar12 = (ulong)uVar21;
      }
      pcVar13 = "\x06\a\b\b\t\t\t\t\n\n\n\n\n\n\n\n\v" + uVar12;
    }
    cVar3 = *pcVar13;
    lVar27 = (long)cVar3;
    sVar4 = av1_eob_group_start[lVar27];
    uVar33 = uVar33 - 10;
    switch(""[uVar14]) {
    case '\0':
      if (cVar43 != '\0') {
        lVar28 = lVar7 + uVar22 * 0x18;
        lVar37 = lVar28 + 0x3c6 + (ulong)(uVar33 < 6) * 0xc;
        puVar29 = (ushort *)(lVar28 + (ulong)(uVar33 < 6) * 0xc + 0x3d0);
        uVar25 = *puVar29;
        bVar16 = (char)(uVar25 >> 4) + 5;
        lVar28 = 0;
        do {
          uVar5 = *(ushort *)(lVar37 + lVar28 * 2);
          if (lVar28 < (char)(cVar3 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
          }
          else {
            sVar8 = -(uVar5 >> (bVar16 & 0x1f));
          }
          *(ushort *)(lVar37 + lVar28 * 2) = sVar8 + uVar5;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 4);
LAB_00a55a6d:
        *puVar29 = *puVar29 + (ushort)(uVar25 < 0x20);
      }
      break;
    case '\x01':
      if (cVar43 != '\0') {
        lVar37 = uVar22 * 0x1c + lVar7;
        lVar28 = (ulong)(uVar33 < 6) * 0x10 + (ulong)(uVar33 < 6) * -2;
        lVar36 = lVar28 + lVar37 + 0x3f6;
        puVar29 = (ushort *)(lVar37 + lVar28 + 0x402);
        uVar25 = *puVar29;
        bVar16 = (char)(uVar25 >> 4) + 5;
        lVar28 = 0;
        do {
          uVar5 = *(ushort *)(lVar36 + lVar28 * 2);
          if (lVar28 < (char)(cVar3 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
          }
          else {
            sVar8 = -(uVar5 >> (bVar16 & 0x1f));
          }
          *(ushort *)(lVar36 + lVar28 * 2) = sVar8 + uVar5;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 5);
        goto LAB_00a55a6d;
      }
      break;
    case '\x02':
      if (cVar43 != '\0') {
        lVar37 = (ulong)bVar9 * 0x20 + lVar7;
        lVar28 = (ulong)(uVar33 < 6) * 0x10;
        lVar36 = lVar28 + lVar37 + 0x42e;
        puVar29 = (ushort *)(lVar37 + lVar28 + 0x43c);
        uVar25 = *puVar29;
        bVar16 = (char)(uVar25 >> 4) + 5;
        lVar28 = 0;
        do {
          uVar5 = *(ushort *)(lVar36 + lVar28 * 2);
          if (lVar28 < (char)(cVar3 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
          }
          else {
            sVar8 = -(uVar5 >> (bVar16 & 0x1f));
          }
          *(ushort *)(lVar36 + lVar28 * 2) = sVar8 + uVar5;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 6);
        goto LAB_00a55a6d;
      }
      break;
    case '\x03':
      if (cVar43 != '\0') {
        lVar28 = lVar7 + uVar22 * 0x24;
        lVar37 = lVar28 + 0x46e + (ulong)(uVar33 < 6) * 0x12;
        puVar29 = (ushort *)(lVar28 + (ulong)(uVar33 < 6) * 0x12 + 0x47e);
        uVar25 = *puVar29;
        bVar16 = (char)(uVar25 >> 4) + 5;
        lVar28 = 0;
        do {
          uVar5 = *(ushort *)(lVar37 + lVar28 * 2);
          if (lVar28 < (char)(cVar3 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
          }
          else {
            sVar8 = -(uVar5 >> (bVar16 & 0x1f));
          }
          *(ushort *)(lVar37 + lVar28 * 2) = sVar8 + uVar5;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 7);
        goto LAB_00a55a6d;
      }
      break;
    case '\x04':
      if (cVar43 != '\0') {
        lVar28 = lVar7 + uVar22 * 0x28;
        lVar37 = lVar28 + 0x4b6 + (ulong)(uVar33 < 6) * 0x14;
        puVar29 = (ushort *)(lVar28 + (ulong)(uVar33 < 6) * 0x14 + 0x4c8);
        uVar25 = *puVar29;
        bVar16 = (char)(uVar25 >> 4) + 5;
        lVar28 = 0;
        do {
          uVar5 = *(ushort *)(lVar37 + lVar28 * 2);
          if (lVar28 < (char)(cVar3 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
          }
          else {
            sVar8 = -(uVar5 >> (bVar16 & 0x1f));
          }
          *(ushort *)(lVar37 + lVar28 * 2) = sVar8 + uVar5;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 8);
        goto LAB_00a55a6d;
      }
      break;
    case '\x05':
      if (cVar43 != '\0') {
        lVar37 = uVar22 * 0x2c + lVar7;
        lVar28 = (ulong)(uVar33 < 6) * 0x16;
        lVar36 = lVar37 + lVar28 + 0x506;
        puVar29 = (ushort *)(lVar37 + lVar28 + 0x51a);
        uVar25 = *puVar29;
        bVar16 = (char)(uVar25 >> 4) + 5;
        lVar28 = 0;
        do {
          uVar5 = *(ushort *)(lVar36 + lVar28 * 2);
          if (lVar28 < (char)(cVar3 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
          }
          else {
            sVar8 = -(uVar5 >> (bVar16 & 0x1f));
          }
          *(ushort *)(lVar36 + lVar28 * 2) = sVar8 + uVar5;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 9);
        goto LAB_00a55a6d;
      }
      break;
    default:
      if (cVar43 != '\0') {
        lVar28 = (ulong)((uint)bVar9 * 0x30) + lVar7;
        lVar37 = lVar28 + (ulong)(uVar33 < 6) * 0x18 + 0x55e;
        puVar29 = (ushort *)(lVar28 + (ulong)(uVar33 < 6) * 0x18 + 0x574);
        uVar25 = *puVar29;
        bVar16 = (char)(uVar25 >> 4) + 5;
        lVar28 = 0;
        do {
          uVar5 = *(ushort *)(lVar37 + lVar28 * 2);
          if (lVar28 < (char)(cVar3 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
          }
          else {
            sVar8 = -(uVar5 >> (bVar16 & 0x1f));
          }
          *(ushort *)(lVar37 + lVar28 * 2) = sVar8 + uVar5;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 10);
        goto LAB_00a55a6d;
      }
    }
    if ((cVar43 != '\0') && (0 < av1_eob_offset_bits[lVar27])) {
      lVar28 = uVar22 * 0x36 + (ulong)((uint)bVar18 + (uint)bVar19 + 1 >> 1 & 0xff) * 0x6c + lVar7 +
               lVar27 * 6;
      uVar25 = *(ushort *)(lVar28 + 0x178);
      bVar18 = (char)(uVar25 >> 4) + 4;
      uVar5 = *(ushort *)(lVar28 + 0x174);
      if ((uVar20 - (int)sVar4 >> ((byte)((char)av1_eob_offset_bits[lVar27] - 1) & 0x1f) & 1) == 0)
      {
        sVar4 = -(uVar5 >> (bVar18 & 0x1f));
      }
      else {
        sVar4 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar18 & 0x1f));
      }
      *(ushort *)(lVar28 + 0x174) = sVar4 + uVar5;
      *(ushort *)(lVar28 + 0x178) = uVar25 + (uVar25 < 0x20);
    }
    av1_get_nz_map_contexts_sse2(levels_buf,scan,eob,tx_size,tx_class,coeff_contexts);
    cVar3 = *(char *)(lVar24 + 0x9ae91);
    bVar18 = (byte)iVar34;
    iVar34 = 1 << (bVar18 & 0x1f);
    iVar35 = iVar34 + 4;
    if (2 < (byte)uVar10) {
      local_15b0 = 3;
    }
    uVar14 = (ulong)(uVar20 - 1);
    do {
      sVar4 = scan[uVar14];
      lVar24 = (long)coeff_contexts[sVar4];
      uVar21 = *(uint *)((long)local_15f0->pre + (long)sVar4 * 4 + -0x30);
      uVar10 = -uVar21;
      if (0 < (int)uVar21) {
        uVar10 = uVar21;
      }
      if (cVar3 != '\0') {
        *(long *)(lVar6 + 0x25d30) = *(long *)(lVar6 + 0x25d30) + (ulong)uVar10;
      }
      if (cVar43 != '\0') {
        uVar33 = 3;
        if (uVar10 < 3) {
          uVar33 = (ulong)uVar10;
        }
        if (uVar14 == uVar20 - 1) {
          lVar28 = (ulong)bVar9 * 0x20 + (ulong)(uVar38 << 6) + lVar7 + 0x5be;
          lVar27 = lVar28 + lVar24 * 8;
          puVar29 = (ushort *)(lVar28 + lVar24 * 8 + 6);
          uVar25 = *puVar29;
          bVar19 = (char)(uVar25 >> 4) + 4;
          lVar24 = 0;
          do {
            uVar5 = *(ushort *)(lVar27 + lVar24 * 2);
            if (lVar24 < (long)(uVar33 - 1)) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar19 & 0x1f));
            }
            else {
              sVar8 = -(uVar5 >> (bVar19 & 0x1f));
            }
            *(ushort *)(lVar27 + lVar24 * 2) = sVar8 + uVar5;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 2);
        }
        else {
          lVar28 = uVar22 * 0x1a4 + (ulong)uVar38 * 0x348 + lVar7 + 0x6fe;
          lVar27 = lVar28 + lVar24 * 10;
          puVar29 = (ushort *)(lVar28 + lVar24 * 10 + 8);
          uVar25 = *puVar29;
          bVar19 = (char)(uVar25 >> 4) + 5;
          uVar12 = 0;
          do {
            uVar5 = *(ushort *)(lVar27 + uVar12 * 2);
            if (uVar12 < uVar33) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar19 & 0x1f));
            }
            else {
              sVar8 = -(uVar5 >> (bVar19 & 0x1f));
            }
            *(ushort *)(lVar27 + uVar12 * 2) = sVar8 + uVar5;
            uVar12 = uVar12 + 1;
          } while (uVar12 != 3);
        }
        *puVar29 = *puVar29 + (ushort)(uVar25 < 0x20);
      }
      if (2 < uVar10) {
        iVar26 = (int)sVar4 >> (bVar18 & 0x1f);
        iVar30 = iVar26 << (bVar18 & 0x1f);
        iVar39 = sVar4 - iVar30;
        iVar40 = iVar26 * iVar35 + iVar39;
        lVar24 = (long)(iVar40 + iVar35);
        uVar21 = (uint)levels_buf[lVar24] + (uint)levels_buf[(long)iVar40 + 1];
        if (tx_class == '\x02') {
          uVar21 = uVar21 + levels_buf[(long)iVar40 + 2] + 1 >> 1;
          if (5 < uVar21) {
            uVar21 = 6;
          }
          if (sVar4 != 0) {
            if (sVar4 != iVar30) goto LAB_00a55de0;
LAB_00a55e08:
            uVar21 = uVar21 + 7;
          }
        }
        else {
          if (tx_class == '\x01') {
            uVar21 = uVar21 + levels_buf[iVar40 + iVar34 * 2 + 8] + 1 >> 1;
            if (5 < uVar21) {
              uVar21 = 6;
            }
            if (sVar4 == 0) goto LAB_00a55e0b;
            if (iVar26 == 0) goto LAB_00a55e08;
          }
          else if (tx_class == '\0') {
            uVar21 = uVar21 + levels_buf[lVar24 + 1] + 1 >> 1;
            if (5 < uVar21) {
              uVar21 = 6;
            }
            if (sVar4 == 0) goto LAB_00a55e0b;
            if ((iVar26 < 2) && (iVar39 < 2)) goto LAB_00a55e08;
          }
LAB_00a55de0:
          uVar21 = uVar21 + 0xe;
        }
LAB_00a55e0b:
        lVar24 = (ulong)(uVar21 * 2) * 5;
        lVar27 = lVar7 + 0x1766 + (ulong)local_15b0 * 0x1a4 + uVar22 * 0xd2 + lVar24;
        lVar24 = lVar24 + (ulong)local_15b0 * 0x1a4 + uVar22 * 0xd2 + lVar7 + 0x1766;
        uVar21 = 0;
        do {
          iVar26 = (uVar10 - 3) - uVar21;
          if (cVar43 != '\0') {
            iVar30 = 3;
            if (iVar26 < 3) {
              iVar30 = iVar26;
            }
            uVar25 = *(ushort *)(lVar27 + 8);
            bVar19 = (char)(uVar25 >> 4) + 5;
            lVar28 = 0;
            do {
              uVar5 = *(ushort *)(lVar24 + lVar28 * 2);
              if (lVar28 < (char)iVar30) {
                sVar4 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar19 & 0x1f));
              }
              else {
                sVar4 = -(uVar5 >> (bVar19 & 0x1f));
              }
              *(ushort *)(lVar24 + lVar28 * 2) = sVar4 + uVar5;
              lVar28 = lVar28 + 1;
            } while (lVar28 != 3);
            psVar1 = (short *)(lVar27 + 8);
            *psVar1 = *psVar1 + (ushort)(uVar25 < 0x20);
          }
        } while ((2 < iVar26) && (bVar44 = uVar21 < 9, uVar21 = uVar21 + 3, bVar44));
      }
      iVar26 = (int)uVar14;
      uVar14 = uVar14 - 1;
    } while (0 < iVar26);
    if (*(int *)__dest != 0) {
      if (cVar43 != '\0') {
        lVar7 = lVar7 + uVar22 * 0x12 + (long)txb_ctx.dc_sign_ctx * 6;
        bVar9 = (char)(*(ushort *)(lVar7 + 0x3a6) >> 4) + 4;
        uVar25 = *(ushort *)(lVar7 + 0x3a2);
        if (*(int *)__dest < 0) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar25) >> (bVar9 & 0x1f));
        }
        else {
          sVar4 = -(uVar25 >> (bVar9 & 0x1f));
        }
        *(ushort *)(lVar7 + 0x3a2) = uVar25 + sVar4;
        *(short *)(lVar7 + 0x3a6) =
             *(short *)(lVar7 + 0x3a6) + (ushort)(*(ushort *)(lVar7 + 0x3a6) < 0x20);
      }
      pbVar42 = (byte *)(lVar32 + lVar41);
      *pbVar42 = *pbVar42 | (char)txb_ctx.dc_sign_ctx << 4;
    }
  }
  local_15f0 = __dest;
  if (eob == 0) {
    return;
  }
LAB_00a55f78:
  bVar9 = av1_get_txb_entropy_context
                    ((tran_low_t *)local_15f0,av1_scan_orders[tx_size] + bVar15,uVar20);
  av1_set_entropy_contexts
            ((MACROBLOCKD *)(lVar6 + 0x1a0),pd,plane,plane_bsize,tx_size,(uint)bVar9,blk_col,blk_row
            );
  return;
}

Assistant:

void av1_update_and_record_txb_context(int plane, int block, int blk_row,
                                       int blk_col, BLOCK_SIZE plane_bsize,
                                       TX_SIZE tx_size, void *arg) {
  struct tokenize_b_args *const args = arg;
  const AV1_COMP *cpi = args->cpi;
  const AV1_COMMON *cm = &cpi->common;
  ThreadData *const td = args->td;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  const int eob = p->eobs[block];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  const PLANE_TYPE plane_type = pd->plane_type;
  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  tran_low_t *tcoeff;
  assert(args->dry_run != DRY_RUN_COSTCOEFFS);
  if (args->dry_run == OUTPUT_ENABLED) {
    MB_MODE_INFO *mbmi = xd->mi[0];
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, plane,
                pd->above_entropy_context + blk_col,
                pd->left_entropy_context + blk_row, &txb_ctx);
    const int bhl = get_txb_bhl(tx_size);
    const int width = get_txb_wide(tx_size);
    const int height = get_txb_high(tx_size);
    const uint8_t allow_update_cdf = args->allow_update_cdf;
    const TX_SIZE txsize_ctx = get_txsize_entropy_ctx(tx_size);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
#if CONFIG_ENTROPY_STATS
    int cdf_idx = cm->coef_cdf_category;
    ++td->counts->txb_skip[cdf_idx][txsize_ctx][txb_ctx.txb_skip_ctx][eob == 0];
#endif  // CONFIG_ENTROPY_STATS
    if (allow_update_cdf) {
      update_cdf(ec_ctx->txb_skip_cdf[txsize_ctx][txb_ctx.txb_skip_ctx],
                 eob == 0, 2);
    }

    CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
    const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                           (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
    uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
    uint8_t *const entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
    entropy_ctx[block] = txb_ctx.txb_skip_ctx;
    eob_txb[block] = eob;

    if (eob == 0) {
      av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, 0, blk_col,
                               blk_row);
      return;
    }
    const int segment_id = mbmi->segment_id;
    const int seg_eob = av1_get_tx_eob(&cpi->common.seg, segment_id, tx_size);
    tran_low_t *tcoeff_txb =
        cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
    tcoeff = tcoeff_txb + block_offset;
    memcpy(tcoeff, qcoeff, sizeof(*tcoeff) * seg_eob);

    uint8_t levels_buf[TX_PAD_2D];
    uint8_t *const levels = set_levels(levels_buf, height);
    av1_txb_init_levels(tcoeff, width, height, levels);
    update_tx_type_count(cpi, cm, xd, blk_row, blk_col, plane, tx_size,
                         td->counts, allow_update_cdf);

    const TX_CLASS tx_class = tx_type_to_class[tx_type];
    const int16_t *const scan = scan_order->scan;

    // record tx type usage
    td->rd_counts.tx_type_used[tx_size][tx_type]++;

#if CONFIG_ENTROPY_STATS
    update_eob_context(cdf_idx, eob, tx_size, tx_class, plane_type, ec_ctx,
                       td->counts, allow_update_cdf);
#else
    update_eob_context(eob, tx_size, tx_class, plane_type, ec_ctx,
                       allow_update_cdf);
#endif

    DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
    av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class,
                            coeff_contexts);

    for (int c = eob - 1; c >= 0; --c) {
      const int pos = scan[c];
      const int coeff_ctx = coeff_contexts[pos];
      const tran_low_t v = qcoeff[pos];
      const tran_low_t level = abs(v);
      /* abs_sum_level is needed to decide the job scheduling order of
       * pack bitstream multi-threading. This data is not needed if
       * multi-threading is disabled. */
      if (cpi->mt_info.pack_bs_mt_enabled) td->abs_sum_level += level;

      if (allow_update_cdf) {
        if (c == eob - 1) {
          assert(coeff_ctx < 4);
          update_cdf(
              ec_ctx->coeff_base_eob_cdf[txsize_ctx][plane_type][coeff_ctx],
              AOMMIN(level, 3) - 1, 3);
        } else {
          update_cdf(ec_ctx->coeff_base_cdf[txsize_ctx][plane_type][coeff_ctx],
                     AOMMIN(level, 3), 4);
        }
      }
      if (c == eob - 1) {
        assert(coeff_ctx < 4);
#if CONFIG_ENTROPY_STATS
        ++td->counts->coeff_base_eob_multi[cdf_idx][txsize_ctx][plane_type]
                                          [coeff_ctx][AOMMIN(level, 3) - 1];
      } else {
        ++td->counts->coeff_base_multi[cdf_idx][txsize_ctx][plane_type]
                                      [coeff_ctx][AOMMIN(level, 3)];
#endif
      }
      if (level > NUM_BASE_LEVELS) {
        const int base_range = level - 1 - NUM_BASE_LEVELS;
        const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
        for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
          const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
          if (allow_update_cdf) {
            update_cdf(ec_ctx->coeff_br_cdf[AOMMIN(txsize_ctx, TX_32X32)]
                                           [plane_type][br_ctx],
                       k, BR_CDF_SIZE);
          }
          for (int lps = 0; lps < BR_CDF_SIZE - 1; lps++) {
#if CONFIG_ENTROPY_STATS
            ++td->counts->coeff_lps[AOMMIN(txsize_ctx, TX_32X32)][plane_type]
                                   [lps][br_ctx][lps == k];
#endif  // CONFIG_ENTROPY_STATS
            if (lps == k) break;
          }
#if CONFIG_ENTROPY_STATS
          ++td->counts->coeff_lps_multi[cdf_idx][AOMMIN(txsize_ctx, TX_32X32)]
                                       [plane_type][br_ctx][k];
#endif
          if (k < BR_CDF_SIZE - 1) break;
        }
      }
    }
    // Update the context needed to code the DC sign (if applicable)
    if (tcoeff[0] != 0) {
      const int dc_sign = (tcoeff[0] < 0) ? 1 : 0;
      const int dc_sign_ctx = txb_ctx.dc_sign_ctx;
#if CONFIG_ENTROPY_STATS
      ++td->counts->dc_sign[plane_type][dc_sign_ctx][dc_sign];
#endif  // CONFIG_ENTROPY_STATS
      if (allow_update_cdf)
        update_cdf(ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx], dc_sign, 2);
      entropy_ctx[block] |= dc_sign_ctx << DC_SIGN_CTX_SHIFT;
    }
  } else {
    tcoeff = qcoeff;
  }
  const uint8_t cul_level =
      av1_get_txb_entropy_context(tcoeff, scan_order, eob);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level,
                           blk_col, blk_row);
}